

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O3

void * Js::UnboxAsmJsArguments(ScriptFunction *func,Var *origArgs,char *argDst,CallInfo callInfo)

{
  char *pcVar1;
  Which WVar2;
  Type p_Var3;
  code *pcVar4;
  RecyclableObject *instance;
  PropertyRecord *pPVar5;
  bool bVar6;
  AsmJsVarType AVar7;
  ushort uVar8;
  int32 iVar9;
  uint uVar10;
  ProxyEntryPointInfo *pPVar11;
  undefined4 *puVar12;
  FunctionBody *this;
  AsmJsFunctionInfo *this_00;
  ulong uVar13;
  _func_int **pp_Var14;
  int64 iVar15;
  CallInfo CVar16;
  size_t sVar17;
  Var aValue;
  Var aValue_00;
  undefined4 extraout_var;
  ScriptContext *pSVar18;
  char *pcVar19;
  ulong uVar20;
  float fVar21;
  double dVar22;
  undefined1 local_a8 [8];
  ArgumentReader reader;
  CallInfo callInfo_local;
  PropertyRecord *local_78;
  PropertyRecord *highPropRecord;
  RecyclableObject *local_68;
  char *local_60;
  uint local_54;
  PropertyRecord *local_50;
  PropertyRecord *lowPropRecord;
  ScriptContext *local_40;
  char local_31;
  
  reader.super_Arguments.Values = (Type)callInfo;
  local_60 = argDst;
  pPVar11 = ScriptFunction::GetEntryPointInfo(func);
  p_Var3 = pPVar11->jsMethod;
  lowPropRecord = (PropertyRecord *)origArgs;
  if (p_Var3 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                ,0xb8,"(address)","address");
    if (!bVar6) {
LAB_00958bee:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar12 = 0;
  }
  pPVar5 = lowPropRecord;
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  this_00 = (AsmJsFunctionInfo *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo);
  local_40 = (((((func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_31 = DAT_015932dc;
  local_a8 = (undefined1  [8])callInfo;
  reader.super_Arguments.Info = (Type)pPVar5;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_a8,(CallInfo *)&reader.super_Arguments.Values);
  pcVar19 = local_60;
  uVar13 = (ulong)this_00->mArgCount;
  if (this_00->mArgCount == 0) {
LAB_00958b73:
    AsmJsModuleInfo::EnsureHeapAttached(func);
    return p_Var3;
  }
  local_54 = (local_a8._0_4_ & 0xffffff) - 1;
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  callInfo_local = (CallInfo)NAN;
  highPropRecord._4_4_ = NAN;
  uVar20 = 0;
LAB_00958106:
  if ((short)uVar13 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                "mArgCount != Constants::InvalidArgSlot");
    if (!bVar6) goto LAB_00958bee;
    *puVar12 = 0;
    uVar13 = (ulong)this_00->mArgCount;
  }
  if (uVar13 <= uVar20) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                ,0x3b9,"(index < mArgCount)","index < mArgCount");
    if (!bVar6) goto LAB_00958bee;
    *puVar12 = 0;
  }
  WVar2 = (this_00->mArgType).ptr[uVar20];
  pSVar18 = (ScriptContext *)(ulong)WVar2;
  AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
  uVar10 = (uint)uVar20;
  if (local_50._0_1_ == Int) {
    pp_Var14 = (_func_int **)0x0;
    if (uVar10 < local_54) {
      if ((local_31 == '\0') ||
         (bVar6 = VarIs<Js::JavascriptString>
                            ((&lowPropRecord->super_FinalizableObject)[uVar20].
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject), !bVar6)) {
        pp_Var14 = (&lowPropRecord->super_FinalizableObject)[uVar20].super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject;
        if (((ulong)pp_Var14 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
            uVar10 = JavascriptMath::ToInt32_Full(pp_Var14,local_40);
            pp_Var14 = (_func_int **)(ulong)uVar10;
            pcVar19 = local_60;
            goto LAB_009588c9;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar6) goto LAB_00958bee;
          *puVar12 = 0;
        }
        pcVar19 = local_60;
        if (((ulong)pp_Var14 & 0x1ffff00000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar6) goto LAB_00958bee;
          *puVar12 = 0;
        }
      }
      else {
        pp_Var14 = (_func_int **)
                   ConvertStringToInt64
                             ((&lowPropRecord->super_FinalizableObject)[uVar20].
                              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject,pSVar18);
      }
    }
LAB_009588c9:
    pcVar1 = pcVar19 + uVar20 * 8 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(int *)(pcVar19 + uVar20 * 8 + 8) = (int)pp_Var14;
  }
  else {
    uVar8 = this_00->mArgCount;
    if (uVar8 == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                  ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                  "mArgCount != Constants::InvalidArgSlot");
      if (!bVar6) goto LAB_00958bee;
      *puVar12 = 0;
      uVar8 = this_00->mArgCount;
    }
    if (uVar8 <= uVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                  ,0x3b9,"(index < mArgCount)","index < mArgCount");
      if (!bVar6) goto LAB_00958bee;
      *puVar12 = 0;
    }
    WVar2 = (this_00->mArgType).ptr[uVar20];
    pSVar18 = (ScriptContext *)(ulong)WVar2;
    AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
    pPVar5 = lowPropRecord;
    if (local_50._0_1_ == Int64) {
      if (local_31 == '\0') {
LAB_00958bde:
        JavascriptError::ThrowTypeError(local_40,-0x7ff5e49f,(PCWSTR)0x0);
      }
      if (uVar10 < local_54) {
        bVar6 = VarIs<Js::JavascriptString>
                          ((&lowPropRecord->super_FinalizableObject)[uVar20].
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject);
        pp_Var14 = (&pPVar5->super_FinalizableObject)[uVar20].super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject;
        if (bVar6) {
          uVar13 = ConvertStringToInt64(pp_Var14,pSVar18);
        }
        else {
          bVar6 = DynamicObject::IsBaseDynamicObject(pp_Var14);
          pp_Var14 = (&pPVar5->super_FinalizableObject)[uVar20].super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
          if (bVar6) {
            local_68 = VarTo<Js::RecyclableObject>(pp_Var14);
            local_50 = (PropertyRecord *)0x0;
            local_78 = (PropertyRecord *)0x0;
            sVar17 = PAL_wcslen(L"low");
            pSVar18 = local_40;
            ScriptContext::GetOrAddPropertyRecord(local_40,L"low",(int)sVar17,&local_50);
            sVar17 = PAL_wcslen(L"high");
            ScriptContext::GetOrAddPropertyRecord(pSVar18,L"high",(int)sVar17,&local_78);
            instance = local_68;
            aValue = JavascriptOperators::OP_GetProperty(local_68,local_50->pid,pSVar18);
            aValue_00 = JavascriptOperators::OP_GetProperty(instance,local_78->pid,local_40);
            local_68 = (RecyclableObject *)aValue;
            if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00958938;
              iVar9 = JavascriptMath::ToInt32_Full(aValue,local_40);
              local_68 = (RecyclableObject *)CONCAT44(extraout_var,iVar9);
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_00958bee;
              *puVar12 = 0;
LAB_00958938:
              if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar12 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_00958bee;
                *puVar12 = 0;
              }
            }
            if (((ulong)aValue_00 & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)aValue_00 & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)aValue_00 & 0xffff000000000000) == 0x1000000000000) goto LAB_00958ac8;
              uVar10 = JavascriptMath::ToInt32_Full(aValue_00,local_40);
              aValue_00 = (Var)(ulong)uVar10;
              pcVar19 = local_60;
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_00958bee;
              *puVar12 = 0;
LAB_00958ac8:
              pcVar19 = local_60;
              if (((ulong)aValue_00 & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar12 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_00958bee;
                *puVar12 = 0;
              }
            }
            uVar13 = (long)aValue_00 << 0x20 | (ulong)local_68 & 0xffffffff;
          }
          else {
            if (((ulong)pp_Var14 & 0x1ffff00000000) == 0x1000000000000 ||
                ((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
              if (((ulong)pp_Var14 & 0xffff000000000000) == 0x1000000000000) goto LAB_00958990;
              uVar10 = JavascriptMath::ToInt32_Full(pp_Var14,local_40);
              pp_Var14 = (_func_int **)(ulong)uVar10;
              pcVar19 = local_60;
            }
            else {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar12 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_00958bee;
              *puVar12 = 0;
LAB_00958990:
              pcVar19 = local_60;
              if (((ulong)pp_Var14 & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar12 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_00958bee;
                *puVar12 = 0;
              }
            }
            uVar13 = (ulong)(int)pp_Var14;
          }
        }
      }
      else {
        uVar13 = 0;
      }
      *(ulong *)(pcVar19 + uVar20 * 8 + 8) = uVar13;
    }
    else {
      uVar8 = this_00->mArgCount;
      if (uVar8 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                    "mArgCount != Constants::InvalidArgSlot");
        if (!bVar6) goto LAB_00958bee;
        *puVar12 = 0;
        uVar8 = this_00->mArgCount;
      }
      if (uVar8 <= uVar20) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b9,"(index < mArgCount)","index < mArgCount");
        if (!bVar6) goto LAB_00958bee;
        *puVar12 = 0;
      }
      WVar2 = (this_00->mArgType).ptr[uVar20];
      pSVar18 = (ScriptContext *)(ulong)WVar2;
      AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
      if (local_50._0_1_ != Float) {
        uVar8 = this_00->mArgCount;
        if (uVar8 == 0xffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                      "mArgCount != Constants::InvalidArgSlot");
          if (!bVar6) goto LAB_00958bee;
          *puVar12 = 0;
          uVar8 = this_00->mArgCount;
        }
        if (uVar8 <= uVar20) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b9,"(index < mArgCount)","index < mArgCount");
          if (!bVar6) goto LAB_00958bee;
          *puVar12 = 0;
        }
        WVar2 = (this_00->mArgType).ptr[uVar20];
        pSVar18 = (ScriptContext *)(ulong)WVar2;
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
        if (local_50._0_1_ == Double) {
          CVar16 = callInfo_local;
          if (uVar10 < local_54) {
            if ((local_31 == '\0') ||
               (bVar6 = VarIs<Js::JavascriptString>
                                  ((&lowPropRecord->super_FinalizableObject)[uVar20].
                                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject),
               !bVar6)) {
              pp_Var14 = (&lowPropRecord->super_FinalizableObject)[uVar20].
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
              if (((ulong)pp_Var14 & 0x1ffff00000000) == 0x1000000000000 ||
                  ((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
                if (((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
                  if ((ulong)pp_Var14 >> 0x32 == 0) {
                    CVar16 = (CallInfo)JavascriptConversion::ToNumber_Full(pp_Var14,local_40);
                  }
                  else {
                    CVar16 = (CallInfo)((ulong)pp_Var14 ^ 0xfffc000000000000);
                  }
                  goto LAB_00958911;
                }
              }
              else {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar12 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_00958bee;
                *puVar12 = 0;
              }
              CVar16 = (CallInfo)(double)(int)pp_Var14;
            }
            else {
              CVar16 = (CallInfo)
                       ConvertStringToInt64
                                 ((&lowPropRecord->super_FinalizableObject)[uVar20].
                                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject,pSVar18)
              ;
            }
          }
LAB_00958911:
          *(CallInfo *)(pcVar19 + uVar20 * 8 + 8) = CVar16;
          goto LAB_00958918;
        }
        AVar7 = AsmJsFunctionInfo::GetArgType(this_00,(ArgSlot)uVar20);
        if ((byte)(AVar7.which_ - Int32x4) < 0xb) goto LAB_00958bde;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                    ,0x143,"((0))","UNREACHED");
        if (!bVar6) goto LAB_00958bee;
        *puVar12 = 0;
        goto LAB_00958bde;
      }
      fVar21 = highPropRecord._4_4_;
      if (uVar10 < local_54) {
        if ((local_31 == '\0') ||
           (bVar6 = VarIs<Js::JavascriptString>
                              ((&lowPropRecord->super_FinalizableObject)[uVar20].
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject), !bVar6))
        {
          pp_Var14 = (&lowPropRecord->super_FinalizableObject)[uVar20].super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
          if (((ulong)pp_Var14 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)pp_Var14 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)pp_Var14 & 0xffff000000000000) == 0x1000000000000) goto LAB_009588e2;
            if ((ulong)pp_Var14 >> 0x32 == 0) {
              dVar22 = JavascriptConversion::ToNumber_Full(pp_Var14,local_40);
            }
            else {
              dVar22 = (double)((ulong)pp_Var14 ^ 0xfffc000000000000);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar6) goto LAB_00958bee;
            *puVar12 = 0;
LAB_009588e2:
            dVar22 = (double)(int)pp_Var14;
          }
          fVar21 = (float)dVar22;
        }
        else {
          iVar15 = ConvertStringToInt64
                             ((&lowPropRecord->super_FinalizableObject)[uVar20].
                              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject,pSVar18);
          fVar21 = (float)iVar15;
        }
      }
      pcVar1 = pcVar19 + uVar20 * 8 + 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      *(float *)(pcVar19 + uVar20 * 8 + 8) = fVar21;
    }
  }
LAB_00958918:
  uVar20 = uVar20 + 1;
  uVar13 = (ulong)this_00->mArgCount;
  if (uVar13 <= uVar20) goto LAB_00958b73;
  goto LAB_00958106;
}

Assistant:

void * UnboxAsmJsArguments(ScriptFunction* func, Var * origArgs, char * argDst, CallInfo callInfo)
    {
        void * address = reinterpret_cast<void*>(func->GetEntryPointInfo()->jsMethod);
        Assert(address);
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        bool allowTestInputs = CONFIG_FLAG(WasmI64);
#endif
        ArgumentReader reader(&callInfo, origArgs);
        uint actualArgCount = reader.Info.Count - 1; // -1 for ScriptFunction
        argDst = argDst + MachPtr; // add one first so as to skip the ScriptFunction argument
        for (ArgSlot i = 0; i < info->GetArgCount(); i++)
        {

            if (info->GetArgType(i).isInt())
            {
                int32 intVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        intVal = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else
#endif
                        intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                }
                else
                {
                    intVal = 0;
                }

#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(int32*)argDst = intVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isInt64())
            {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (!allowTestInputs)
#endif
                {
                    JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
                }

#if ENABLE_DEBUG_CONFIG_OPTIONS
                int64 val;
                if (i < actualArgCount)
                {
                    if (VarIs<JavascriptString>(*origArgs))
                    {
                        val = ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else if (DynamicObject::IsBaseDynamicObject(*origArgs))
                    {
                        RecyclableObject* object = VarTo<RecyclableObject>(*origArgs);
                        PropertyRecord const * lowPropRecord = nullptr;
                        PropertyRecord const * highPropRecord = nullptr;
                        scriptContext->GetOrAddPropertyRecord(_u("low"), (int)wcslen(_u("low")), &lowPropRecord);
                        scriptContext->GetOrAddPropertyRecord(_u("high"), (int)wcslen(_u("high")), &highPropRecord);
                        Var low = JavascriptOperators::OP_GetProperty(object, lowPropRecord->GetPropertyId(), scriptContext);
                        Var high = JavascriptOperators::OP_GetProperty(object, highPropRecord->GetPropertyId(), scriptContext);

                        uint64 lowVal = JavascriptMath::ToInt32(low, scriptContext);
                        uint64 highVal = JavascriptMath::ToInt32(high, scriptContext);
                        val = (highVal << 32) | (lowVal & 0xFFFFFFFF);
                    }
                    else
                    {
                        int32 intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                        val = (int64)intVal;
                    }
                }
                else
                {
                    val = 0;
                }

                *(int64*)(argDst) = val;
                argDst += sizeof(int64);
#endif
            }
            else if (info->GetArgType(i).isFloat())
            {
                float floatVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int32 val = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                        floatVal = *(float*)&val;
                    }
                    else
#endif
                        floatVal = (float)(JavascriptConversion::ToNumber(*origArgs, scriptContext));
                }
                else
                {
                    floatVal = (float)(JavascriptNumber::NaN);
                }
#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(float*)argDst = floatVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isDouble())
            {
                double doubleVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int64 val = ConvertStringToInt64(*origArgs, scriptContext);
                        doubleVal = *(double*)&val;
                    }
                    else
#endif
                        doubleVal = JavascriptConversion::ToNumber(*origArgs, scriptContext);
                }
                else
                {
                    doubleVal = JavascriptNumber::NaN;
                }

                *(double*)argDst = doubleVal;
                argDst = argDst + sizeof(double);
            }
            else if (info->GetArgType(i).isSIMD())
            {
                // Todo:: support test input for wasm.simd
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            else
            {
                Assert(UNREACHED);
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            ++origArgs;
        }

        AsmJsModuleInfo::EnsureHeapAttached(func);

        // for convenience, lets take the opportunity to return the asm.js entrypoint address
        return address;
    }